

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_cbl(nt_opts *opts)

{
  int iVar1;
  char *__s;
  nifti_image *pnVar2;
  int *__ptr;
  void **data;
  size_t sVar3;
  int local_60;
  int err;
  int *blist;
  char *cp;
  char *selstr;
  char *fname;
  nifti_image *nim;
  nifti_brick_list NBL;
  nt_opts *opts_local;
  
  NBL.bricks = (void **)opts;
  if (2 < g_debug) {
    fprintf(_stderr,"-d copying file info from \'%s\' to \'%s\'\n",*(opts->infiles).list,
            opts->prefix);
  }
  if (NBL.bricks[0x15] == (void *)0x0) {
    fprintf(_stderr,"** error: -prefix is required with -cbl function\n");
    opts_local._4_4_ = 1;
  }
  else if (*(int *)(NBL.bricks + 0x1e) < 2) {
    __s = nifti_strdup(*NBL.bricks[0x1f]);
    blist = (int *)strchr(__s,0x5b);
    if (blist == (int *)0x0) {
      blist = (int *)strchr(__s,0x7b);
    }
    if (blist == (int *)0x0) {
      if (1 < g_debug) {
        fprintf(_stderr,"-d using -cbl without brick list in \'%s\'\n",__s);
      }
      cp = nifti_strdup("[0..$]");
    }
    else {
      cp = nifti_strdup((char *)blist);
      *(undefined1 *)blist = 0;
    }
    if (1 < g_debug) {
      fprintf(_stderr,"+d -cbl: using \'%s\' for selection string\n",cp);
    }
    pnVar2 = nt_image_read((nt_opts *)NBL.bricks,__s,0);
    if (pnVar2 == (nifti_image *)0x0) {
      opts_local._4_4_ = 1;
    }
    else {
      if (pnVar2->nt < 1) {
        local_60 = 1;
      }
      else {
        local_60 = num_volumes(pnVar2);
      }
      __ptr = nifti_get_intlist(local_60,cp);
      nifti_image_free(pnVar2);
      if (__ptr == (int *)0x0) {
        fprintf(_stderr,"** failed sub-brick selection using \'%s\'\n",cp);
        free(__s);
        free(cp);
        opts_local._4_4_ = 1;
      }
      else {
        pnVar2 = nt_read_bricks((nt_opts *)NBL.bricks,__s,*__ptr,__ptr + 1,(nifti_brick_list *)&nim)
        ;
        free(__ptr);
        if (pnVar2 == (nifti_image *)0x0) {
          free(__s);
          free(cp);
          opts_local._4_4_ = 1;
        }
        else {
          if (1 < g_debug) {
            fprintf(_stderr,"+d sub-bricks loaded\n");
          }
          if (*(int *)(NBL.bricks + 0x14) != 0) {
            data = NBL.bricks + 0x20;
            sVar3 = strlen((char *)(NBL.bricks + 0x20));
            iVar1 = nifti_add_extension(pnVar2,(char *)data,(int)sVar3,6);
            if (iVar1 != 0) {
              fprintf(_stderr,"** failed to add command to image as extension\n");
            }
          }
          iVar1 = nifti_set_filenames(pnVar2,(char *)NBL.bricks[0x15],1,1);
          if (iVar1 != 0) {
            fprintf(_stderr,"** failed to set names, prefix = \'%s\'\n",NBL.bricks[0x15]);
          }
          if (2 < g_debug) {
            disp_field("new nim:\n",g_nim_fields,pnVar2,0x3f,1);
          }
          if (iVar1 == 0) {
            iVar1 = nifti_nim_is_valid(pnVar2,g_debug);
            if (iVar1 != 0) {
              nifti_image_write_bricks(pnVar2,(nifti_brick_list *)&nim);
            }
          }
          nifti_image_free(pnVar2);
          nifti_free_NBL((nifti_brick_list *)&nim);
          free(__s);
          free(cp);
          opts_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"** sorry, at the moment -cbl allows only 1 input\n");
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

int act_cbl( nt_opts * opts )
{
   nifti_brick_list   NBL;
   nifti_image      * nim;
   char             * fname, * selstr, * cp;
   int              * blist;
   int                err = 0;

   if( g_debug > 2 )
      fprintf(stderr,"-d copying file info from '%s' to '%s'\n",
              opts->infiles.list[0], opts->prefix);

   /* sanity checks */
   if( ! opts->prefix ) {
      fprintf(stderr,"** error: -prefix is required with -cbl function\n");
      return 1;
   } else if( opts->infiles.len > 1 ) {
      fprintf(stderr,"** sorry, at the moment -cbl allows only 1 input\n");
      return 1;
   }

   /* remove selector from fname, and copy selector string */
   fname = nifti_strdup(opts->infiles.list[0]);
   cp = strchr(fname,'[');  if( !cp )  cp = strchr(fname,'{');

   if( !cp ) {
      if( g_debug > 1 )
         fprintf(stderr,"-d using -cbl without brick list in '%s'\n",fname);
      selstr = nifti_strdup("[0..$]");
   } else {
      selstr = nifti_strdup(cp);
      *cp = '\0';    /* remove selection string from fname */
   }

   if( g_debug > 1 )
      fprintf(stderr,"+d -cbl: using '%s' for selection string\n", selstr);

   nim = nt_image_read(opts, fname, 0);  /* get image */
   if( !nim ) return 1;

   /* since nt can be zero now (sigh), check for it   02 Mar 2006 [rickr] */
   blist = nifti_get_intlist(nim->nt > 0 ? num_volumes(nim) : 1, selstr);
   nifti_image_free(nim);             /* throw away, will re-load */
   if( !blist ){
      fprintf(stderr,"** failed sub-brick selection using '%s'\n",selstr);
      free(fname);  free(selstr);  return 1;
   }

   nim = nt_read_bricks(opts, fname, blist[0], blist+1, &NBL);
   free(blist);  /* with this */
   if( !nim ){  free(fname);  free(selstr);  return 1; }

   if( g_debug > 1 ) fprintf(stderr,"+d sub-bricks loaded\n");

   /* add command as COMMENT extension */
   if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                          strlen(opts->command), NIFTI_ECODE_COMMENT) )
      fprintf(stderr,"** failed to add command to image as extension\n");

   /* replace filenames using prefix */
   if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
   {
      fprintf(stderr,"** failed to set names, prefix = '%s'\n",opts->prefix);
      err++;
   }

   if(g_debug>2) disp_field("new nim:\n",g_nim_fields,nim,NT_NIM_NUM_FIELDS,1);

   /* and finally, write out results */
   if( err == 0 && nifti_nim_is_valid(nim, g_debug) )
      nifti_image_write_bricks(nim, &NBL);

   nifti_image_free(nim);
   nifti_free_NBL(&NBL);
   free(fname);
   free(selstr);

   return 0;
}